

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O0

void start_output_bmp(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo)

{
  long in_RSI;
  bmp_dest_ptr dest;
  bmp_dest_ptr in_stack_00000018;
  j_decompress_ptr in_stack_00000020;
  bmp_dest_ptr in_stack_00000038;
  j_decompress_ptr in_stack_00000040;
  
  if (*(int *)(in_RSI + 0x58) == 0) {
    if (*(int *)(in_RSI + 0x38) == 0) {
      write_bmp_header(in_stack_00000040,in_stack_00000038);
    }
    else {
      write_os2_header(in_stack_00000020,in_stack_00000018);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
start_output_bmp(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo)
{
  bmp_dest_ptr dest = (bmp_dest_ptr)dinfo;

  if (!dest->use_inversion_array) {
    /* Write the header and colormap */
    if (dest->is_os2)
      write_os2_header(cinfo, dest);
    else
      write_bmp_header(cinfo, dest);
  }
}